

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *
pbrt::BilinearPatch::CreatePatches
          (vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>
           *__return_storage_ptr__,BilinearPatchMesh *mesh,Allocator alloc)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t n;
  long lVar3;
  BilinearPatch *pBVar4;
  BilinearPatchMesh *mesh_local;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> *local_48;
  int vb;
  size_t va;
  BilinearPatch *this;
  
  uVar1 = allMeshes->nStored;
  vb = -0x80000000;
  mesh_local = mesh;
  va = uVar1;
  if (uVar1 < 0xffffffff80000000) {
    pstd::
    vector<const_pbrt::BilinearPatchMesh_*,_pstd::pmr::polymorphic_allocator<const_pbrt::BilinearPatchMesh_*>_>
    ::push_back(allMeshes,&mesh_local);
    n = (size_t)mesh_local->nPatches;
    (__return_storage_ptr__->alloc).memoryResource = alloc.memoryResource;
    __return_storage_ptr__->ptr = (ShapeHandle *)0x0;
    __return_storage_ptr__->nAlloc = 0;
    __return_storage_ptr__->nStored = 0;
    local_48 = __return_storage_ptr__;
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::reserve
              (__return_storage_ptr__,n);
    if (n != 0) {
      memset(__return_storage_ptr__->ptr,0,n * 8);
    }
    local_48->nStored = n;
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])
                      (alloc.memoryResource,(long)mesh_local->nPatches * 0xc,4);
    this = (BilinearPatch *)CONCAT44(extraout_var,iVar2);
    if (0 < mesh_local->nPatches) {
      lVar3 = 0;
      pBVar4 = this;
      do {
        BilinearPatch(this,(int)uVar1,(int)lVar3);
        __return_storage_ptr__->ptr[lVar3].
        super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
        .bits = (ulong)pBVar4 | 0x5000000000000;
        lVar3 = lVar3 + 1;
        pBVar4 = pBVar4 + 1;
        this = this + 1;
      } while (lVar3 < mesh_local->nPatches);
    }
    return local_48;
  }
  LogFatal<char_const(&)[18],char_const(&)[8],char_const(&)[18],unsigned_long&,char_const(&)[8],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/shapes.cpp"
             ,0x3cf,"Check failed: %s < %s with %s = %s, %s = %s",(char (*) [18])"allMeshes->size()"
             ,(char (*) [8])"1 << 31",(char (*) [18])"allMeshes->size()",&va,(char (*) [8])"1 << 31"
             ,&vb);
}

Assistant:

pstd::vector<ShapeHandle> BilinearPatch::CreatePatches(const BilinearPatchMesh *mesh,
                                                       Allocator alloc) {
    CHECK_LT(allMeshes->size(), 1 << 31);
    int meshIndex = int(allMeshes->size());

    allMeshes->push_back(mesh);

    pstd::vector<ShapeHandle> blps(mesh->nPatches, alloc);
    BilinearPatch *patches = alloc.allocate_object<BilinearPatch>(mesh->nPatches);
    for (int i = 0; i < mesh->nPatches; ++i) {
        alloc.construct(&patches[i], meshIndex, i);
        blps[i] = &patches[i];
    }

    return blps;
}